

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O0

bool dxil_spv::emit_physical_buffer_load_instruction
               (Impl *impl,CallInst *instruction,PhysicalPointerMeta *ptr_meta,uint32_t mask,
               uint32_t alignment)

{
  Operation *this;
  undefined8 uVar1;
  CallInst *pCVar2;
  bool bVar3;
  Id arg;
  uint uVar4;
  Id IVar5;
  Builder *this_00;
  void *pvVar6;
  Type *pTVar7;
  Value *value;
  mapped_type *pmVar8;
  uint8_t local_10ac;
  key_type local_10a0;
  Operation *local_1098;
  Operation *cast_op;
  Id type_id;
  Id loaded_id;
  Operation *load_op;
  Operation *chain_op;
  Operation *ptr_bitcast_op;
  Id u64_ptr_id;
  Id ptr_type_id;
  PhysicalPointerMeta tmp_ptr_meta;
  Op value_cast_op;
  Id physical_type_id;
  Id array_id;
  Type *element_type;
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  uint vecsize;
  Builder *builder;
  uint32_t alignment_local;
  uint32_t mask_local;
  PhysicalPointerMeta *ptr_meta_local;
  CallInst *instruction_local;
  Impl *impl_local;
  
  builder._0_4_ = alignment;
  builder._4_4_ = mask;
  _alignment_local = ptr_meta;
  ptr_meta_local = (PhysicalPointerMeta *)instruction;
  instruction_local = (CallInst *)impl;
  this_00 = Converter::Impl::builder(impl);
  if ((builder._4_4_ != 0) ||
     (bVar3 = get_constant_operand((Instruction *)ptr_meta_local,4,(uint32_t *)((long)&builder + 4))
     , bVar3)) {
    if (((uint32_t)builder != 0) ||
       (bVar3 = get_constant_operand((Instruction *)ptr_meta_local,5,(uint32_t *)&builder), bVar3))
    {
      if (builder._4_4_ == 1) {
        cb._4_4_ = 1;
      }
      else if (builder._4_4_ == 3) {
        cb._4_4_ = 2;
      }
      else if (builder._4_4_ == 7) {
        cb._4_4_ = 3;
      }
      else {
        if (builder._4_4_ != 0xf) {
          buffer._4088_8_ = get_thread_log_callback();
          if ((LoggingCallback)buffer._4088_8_ == (LoggingCallback)0x0) {
            fprintf(_stderr,"[ERROR]: Unexpected mask for RawBufferLoad = %u.\n",
                    (ulong)builder._4_4_);
            fflush(_stderr);
          }
          else {
            snprintf((char *)&element_type,0x1000,"Unexpected mask for RawBufferLoad = %u.\n",
                     (ulong)builder._4_4_);
            uVar1 = buffer._4088_8_;
            pvVar6 = get_thread_log_callback_userdata();
            (*(code *)uVar1)(pvVar6,2,&element_type);
          }
          return false;
        }
        cb._4_4_ = 4;
      }
      pTVar7 = LLVMBC::Value::getType((Value *)ptr_meta_local);
      pTVar7 = LLVMBC::Type::getStructElementType(pTVar7,0);
      arg = build_vectorized_physical_load_store_access
                      ((Impl *)instruction_local,(CallInst *)ptr_meta_local,cb._4_4_,pTVar7);
      get_physical_load_store_cast_info
                ((Impl *)instruction_local,pTVar7,&tmp_ptr_meta.size,(Op *)&tmp_ptr_meta.stride);
      if (1 < cb._4_4_) {
        tmp_ptr_meta.size = spv::Builder::makeVectorType(this_00,tmp_ptr_meta.size,cb._4_4_);
      }
      u64_ptr_id._0_1_ = _alignment_local->nonwritable;
      u64_ptr_id._1_1_ = _alignment_local->nonreadable;
      u64_ptr_id._2_1_ = _alignment_local->coherent;
      u64_ptr_id._3_1_ = _alignment_local->rov;
      ptr_type_id._0_1_ = _alignment_local->stride;
      ptr_type_id._1_3_ = *(undefined3 *)&_alignment_local->field_0x5;
      tmp_ptr_meta._0_4_ = _alignment_local->size;
      if (arg == 0) {
        local_10ac = '\0';
      }
      else {
        uVar4 = get_type_scalar_alignment((Impl *)instruction_local,pTVar7);
        local_10ac = (char)cb._4_4_ * (char)uVar4;
      }
      ptr_type_id._0_1_ = local_10ac;
      ptr_bitcast_op._4_4_ =
           Converter::Impl::get_physical_pointer_block_type
                     ((Impl *)instruction_local,tmp_ptr_meta.size,(PhysicalPointerMeta *)&u64_ptr_id
                     );
      pCVar2 = instruction_local;
      if (arg == 0) {
        ptr_bitcast_op._0_4_ =
             build_physical_pointer_address_for_raw_load_store
                       ((Impl *)instruction_local,(CallInst *)ptr_meta_local);
      }
      else {
        value = LLVMBC::Instruction::getOperand((Instruction *)ptr_meta_local,1);
        ptr_bitcast_op._0_4_ = Converter::Impl::get_id_for_value((Impl *)pCVar2,value,0);
      }
      emit_buffer_synchronization_validation
                ((Impl *)instruction_local,(CallInst *)ptr_meta_local,Load);
      chain_op = Converter::Impl::allocate((Impl *)instruction_local,OpBitcast,ptr_bitcast_op._4_4_)
      ;
      Operation::add_id(chain_op,(Id)ptr_bitcast_op);
      Converter::Impl::add((Impl *)instruction_local,chain_op,false);
      pCVar2 = instruction_local;
      IVar5 = spv::Builder::makePointer(this_00,StorageClassPhysicalStorageBuffer,tmp_ptr_meta.size)
      ;
      load_op = Converter::Impl::allocate((Impl *)pCVar2,OpInBoundsAccessChain,IVar5);
      Operation::add_id(load_op,chain_op->id);
      this = load_op;
      IVar5 = spv::Builder::makeUintConstant(this_00,0,false);
      Operation::add_id(this,IVar5);
      if (arg != 0) {
        Operation::add_id(load_op,arg);
      }
      Converter::Impl::add((Impl *)instruction_local,load_op,false);
      _type_id = Converter::Impl::allocate((Impl *)instruction_local,OpLoad,tmp_ptr_meta.size);
      Operation::add_id(_type_id,load_op->id);
      Operation::add_literal(_type_id,2);
      Operation::add_literal(_type_id,(uint32_t)builder);
      Converter::Impl::add((Impl *)instruction_local,_type_id,(bool)(_alignment_local->rov & 1));
      cast_op._4_4_ = _type_id->id;
      if (tmp_ptr_meta._4_4_ != 0) {
        cast_op._0_4_ = Converter::Impl::get_type_id((Impl *)instruction_local,pTVar7,0);
        if (1 < cb._4_4_) {
          cast_op._0_4_ = spv::Builder::makeVectorType(this_00,(Id)cast_op,cb._4_4_);
        }
        local_1098 = Converter::Impl::allocate
                               ((Impl *)instruction_local,tmp_ptr_meta._4_4_,(Id)cast_op);
        Operation::add_id(local_1098,cast_op._4_4_);
        Converter::Impl::add((Impl *)instruction_local,local_1098,false);
        cast_op._4_4_ = local_1098->id;
      }
      Converter::Impl::rewrite_value
                ((Impl *)instruction_local,(Value *)ptr_meta_local,cast_op._4_4_);
      if (cb._4_4_ == 1) {
        local_10a0 = (key_type)ptr_meta_local;
        pmVar8 = std::
                 unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::CompositeMeta,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>_>
                 ::operator[]((unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::CompositeMeta,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>_>
                               *)&instruction_local[10].super_Instruction.attachments._M_h.
                                  _M_before_begin,&local_10a0);
        pmVar8->forced_composite = false;
      }
      build_exploded_composite_from_vector
                ((Impl *)instruction_local,(Instruction *)ptr_meta_local,cb._4_4_);
      impl_local._7_1_ = true;
    }
    else {
      impl_local._7_1_ = false;
    }
  }
  else {
    impl_local._7_1_ = false;
  }
  return impl_local._7_1_;
}

Assistant:

static bool emit_physical_buffer_load_instruction(Converter::Impl &impl, const llvm::CallInst *instruction,
                                                  const Converter::Impl::PhysicalPointerMeta &ptr_meta,
                                                  uint32_t mask = 0, uint32_t alignment = 0)
{
	auto &builder = impl.builder();

	if (mask == 0 && !get_constant_operand(instruction, 4, &mask))
		return false;
	if (alignment == 0 && !get_constant_operand(instruction, 5, &alignment))
		return false;

	unsigned vecsize = 0;
	if (mask == 1)
		vecsize = 1;
	else if (mask == 3)
		vecsize = 2;
	else if (mask == 7)
		vecsize = 3;
	else if (mask == 15)
		vecsize = 4;
	else
	{
		LOGE("Unexpected mask for RawBufferLoad = %u.\n", mask);
		return false;
	}

	auto *element_type = instruction->getType()->getStructElementType(0);
	// If we can express this as a plain access chain, do so for clarity and ideally better perf.
	// If we cannot do it trivially, fallback to raw pointer arithmetic.
	spv::Id array_id = build_vectorized_physical_load_store_access(impl, instruction, vecsize, element_type);

	spv::Id physical_type_id;
	spv::Op value_cast_op;
	get_physical_load_store_cast_info(impl, element_type, physical_type_id, value_cast_op);

	if (vecsize > 1)
		physical_type_id = builder.makeVectorType(physical_type_id, vecsize);

	auto tmp_ptr_meta = ptr_meta;
	tmp_ptr_meta.stride = array_id ? vecsize * get_type_scalar_alignment(impl, element_type) : 0;
	spv::Id ptr_type_id = impl.get_physical_pointer_block_type(physical_type_id, tmp_ptr_meta);

	spv::Id u64_ptr_id;
	if (array_id)
		u64_ptr_id = impl.get_id_for_value(instruction->getOperand(1));
	else
		u64_ptr_id = build_physical_pointer_address_for_raw_load_store(impl, instruction);

	emit_buffer_synchronization_validation(impl, instruction, BDAOperation::Load);

	auto *ptr_bitcast_op = impl.allocate(spv::OpBitcast, ptr_type_id);
	ptr_bitcast_op->add_id(u64_ptr_id);
	impl.add(ptr_bitcast_op);

	auto *chain_op = impl.allocate(spv::OpInBoundsAccessChain,
								   builder.makePointer(spv::StorageClassPhysicalStorageBuffer, physical_type_id));
	chain_op->add_id(ptr_bitcast_op->id);
	chain_op->add_id(builder.makeUintConstant(0));
	if (array_id)
		chain_op->add_id(array_id);
	impl.add(chain_op);

	auto *load_op = impl.allocate(spv::OpLoad, physical_type_id);
	load_op->add_id(chain_op->id);
	load_op->add_literal(spv::MemoryAccessAlignedMask);
	load_op->add_literal(alignment);

	impl.add(load_op, ptr_meta.rov);

	spv::Id loaded_id = load_op->id;

	if (value_cast_op != spv::OpNop)
	{
		spv::Id type_id = impl.get_type_id(element_type);
		if (vecsize > 1)
			type_id = builder.makeVectorType(type_id, vecsize);
		auto *cast_op = impl.allocate(value_cast_op, type_id);
		cast_op->add_id(loaded_id);
		impl.add(cast_op);
		loaded_id = cast_op->id;
	}

	impl.rewrite_value(instruction, loaded_id);

	if (vecsize == 1)
		impl.llvm_composite_meta[instruction].forced_composite = false;

	build_exploded_composite_from_vector(impl, instruction, vecsize);

	return true;
}